

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O2

void __thiscall
dgSphere::SetDimensions
          (dgSphere *this,HaF32 *vertex,HaI32 strideInBytes,HaI32 *triangles,HaI32 indexCount,
          dgMatrix *basis)

{
  bool bVar1;
  undefined1 auVar2 [16];
  dgTemplateVector<float> dVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  long lVar11;
  float *pfVar12;
  int stride;
  uint uVar13;
  uint i;
  int i_00;
  ulong uVar14;
  int iVar15;
  HaF32 *ptr;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  HaF32 HVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  dgVector dVar30;
  HaF32 local_d8;
  float local_c8;
  float fStack_c4;
  dgVector massCenter;
  dgVector dim;
  dgTemplateVector<float> local_88;
  dgTemplateVector<float> local_78;
  undefined1 local_68 [16];
  dgTemplateVector<float> local_50;
  dgVector eigen;
  undefined1 auVar25 [56];
  undefined1 auVar28 [56];
  
  local_88.m_x = 1.0;
  local_88.m_y = 1.0;
  local_88.m_z = 1.0;
  local_88.m_w = 0.0;
  if (2 < indexCount) {
    stride = strideInBytes >> 2;
    if (basis == (dgMatrix *)0x0) {
      InternalSphere::Statistics
                (this,(dgVector *)&eigen.super_dgTemplateVector<float>,(dgVector *)&local_88,vertex,
                 triangles,indexCount,stride);
      uVar13 = 0;
LAB_00d9c837:
      iVar15 = 1;
      i = 0;
      while ((i < 3 && (i_00 = iVar15, uVar13 < 6))) {
        while (i_00 != 3) {
          pfVar12 = dgTemplateVector<float>::operator[](&eigen.super_dgTemplateVector<float>,i);
          HVar20 = (HaF32)*pfVar12;
          pfVar12 = dgTemplateVector<float>::operator[](&eigen.super_dgTemplateVector<float>,i_00);
          HVar20 = InternalSphere::AspectRatio(HVar20,(HaF32)*pfVar12);
          i_00 = i_00 + 1;
          if (0.9 < (float)HVar20) {
            pfVar12 = dgTemplateVector<float>::operator[](&local_88,i);
            *pfVar12 = *pfVar12 + *pfVar12;
            InternalSphere::Statistics
                      (this,(dgVector *)&eigen.super_dgTemplateVector<float>,(dgVector *)&local_88,
                       vertex,triangles,indexCount,stride);
            uVar13 = uVar13 + 1;
            goto LAB_00d9c837;
          }
        }
        i = i + 1;
        iVar15 = iVar15 + 1;
      }
    }
    else {
      fVar7 = (basis->m_front).super_dgTemplateVector<float>.m_y;
      fVar8 = (basis->m_front).super_dgTemplateVector<float>.m_z;
      fVar9 = (basis->m_front).super_dgTemplateVector<float>.m_w;
      (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
           (basis->m_front).super_dgTemplateVector<float>.m_x;
      (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar7;
      (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar8;
      (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = fVar9;
      fVar7 = (basis->m_up).super_dgTemplateVector<float>.m_y;
      fVar8 = (basis->m_up).super_dgTemplateVector<float>.m_z;
      fVar9 = (basis->m_up).super_dgTemplateVector<float>.m_w;
      (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x =
           (basis->m_up).super_dgTemplateVector<float>.m_x;
      (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = fVar7;
      (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar8;
      (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = fVar9;
      fVar7 = (basis->m_right).super_dgTemplateVector<float>.m_y;
      fVar8 = (basis->m_right).super_dgTemplateVector<float>.m_z;
      fVar9 = (basis->m_right).super_dgTemplateVector<float>.m_w;
      (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x =
           (basis->m_right).super_dgTemplateVector<float>.m_x;
      (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar7;
      (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = fVar8;
      (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = fVar9;
      fVar7 = (basis->m_posit).super_dgTemplateVector<float>.m_y;
      fVar8 = (basis->m_posit).super_dgTemplateVector<float>.m_z;
      fVar9 = (basis->m_posit).super_dgTemplateVector<float>.m_w;
      (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x =
           (basis->m_posit).super_dgTemplateVector<float>.m_x;
      (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y = fVar7;
      (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z = fVar8;
      (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_w = fVar9;
    }
    auVar29 = ZEXT464(0x501502f9);
    uVar14 = 0;
    local_d8 = -1e+10;
    auVar4 = _DAT_00f50bf0;
    while( true ) {
      if ((uint)indexCount == uVar14) break;
      lVar11 = (long)triangles[uVar14] * (long)stride;
      auVar25 = (undefined1  [56])0x0;
      auVar28 = (undefined1  [56])0x0;
      dgVector::dgVector(&massCenter,vertex[lVar11],vertex[lVar11 + 1],vertex[lVar11 + 2],0.0);
      dVar30 = dgMatrix::UnrotateVector(&this->super_dgMatrix,&massCenter);
      auVar26._0_8_ = dVar30.super_dgTemplateVector<float>._8_8_;
      auVar26._8_56_ = auVar28;
      auVar24._0_8_ = dVar30.super_dgTemplateVector<float>._0_8_;
      auVar24._8_56_ = auVar25;
      uVar14 = uVar14 + 1;
      auVar19 = vmaxss_avx(auVar24._0_16_,ZEXT416((uint)local_d8));
      auVar2 = vminss_avx(auVar26._0_16_,ZEXT416((uint)auVar29._0_4_));
      auVar29 = ZEXT1664(auVar2);
      local_d8 = auVar19._0_4_;
      auVar17 = vpermt2ps_avx512vl(auVar24._0_16_,_DAT_00f50c00,auVar26._0_16_);
      uVar5 = vcmpps_avx512vl(auVar17,auVar4,1);
      uVar6 = vcmpps_avx512vl(auVar4,auVar17,1);
      auVar19 = vpmovm2d_avx512vl(uVar6);
      auVar2 = vpmovm2d_avx512vl(uVar5);
      auVar19 = vpblendd_avx2(auVar2,auVar19,0xc);
      uVar16 = vpmovd2m_avx512vl(auVar19);
      bVar1 = (bool)((byte)uVar16 & 1);
      auVar18._0_4_ = (uint)bVar1 * auVar17._0_4_ | (uint)!bVar1 * (int)auVar4._0_4_;
      bVar1 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar18._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar4._4_4_;
      bVar1 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar18._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar4._8_4_;
      bVar1 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar18._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar4._12_4_;
      auVar4 = auVar18;
    }
    auVar19 = vmovshdup_avx(auVar4);
    dgVector::dgVector(&massCenter,auVar19._0_4_,auVar4._0_4_,auVar29._0_4_,0.0);
    uVar5 = massCenter.super_dgTemplateVector<float>._0_8_;
    fVar7 = massCenter.super_dgTemplateVector<float>.m_z;
    local_c8 = massCenter.super_dgTemplateVector<float>.m_x;
    fStack_c4 = massCenter.super_dgTemplateVector<float>.m_y;
    auVar19 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vshufps_avx(auVar4,auVar4,0xff);
    dgVector::dgVector(&massCenter,local_d8,auVar4._0_4_,auVar19._0_4_,0.0);
    uVar6 = massCenter.super_dgTemplateVector<float>._0_8_;
    fVar8 = massCenter.super_dgTemplateVector<float>.m_z;
    auVar21._0_4_ = massCenter.super_dgTemplateVector<float>.m_x + local_c8;
    auVar21._4_4_ = massCenter.super_dgTemplateVector<float>.m_y + fStack_c4;
    auVar21._8_8_ = 0;
    local_68 = ZEXT416((uint)massCenter.super_dgTemplateVector<float>.m_w);
    auVar4 = vinsertps_avx(ZEXT416((uint)(massCenter.super_dgTemplateVector<float>.m_z + fVar7)),
                           local_68,0x10);
    dim.super_dgTemplateVector<float> = (dgTemplateVector<float>)vmovlhps_avx(auVar21,auVar4);
    dgVector::dgVector(&massCenter,&dim.super_dgTemplateVector<float>);
    auVar22._8_8_ = 0;
    auVar22._0_4_ = massCenter.super_dgTemplateVector<float>.m_x;
    auVar22._4_4_ = massCenter.super_dgTemplateVector<float>.m_y;
    auVar4._8_4_ = 0x3f000000;
    auVar4._0_8_ = 0x3f0000003f000000;
    auVar4._12_4_ = 0x3f000000;
    auVar19 = vmulps_avx512vl(auVar22,auVar4);
    auVar4 = vinsertps_avx(ZEXT416((uint)(massCenter.super_dgTemplateVector<float>.m_z * 0.5)),
                           ZEXT416((uint)massCenter.super_dgTemplateVector<float>.m_w),0x10);
    auVar28 = ZEXT856(auVar4._8_8_);
    local_78 = (dgTemplateVector<float>)vmovlhps_avx(auVar19,auVar4);
    dgVector::dgVector(&dim,&local_78);
    dVar30 = dim;
    auVar25 = ZEXT856((ulong)dim.super_dgTemplateVector<float>._8_8_);
    massCenter.super_dgTemplateVector<float>.m_x = dim.super_dgTemplateVector<float>.m_x;
    massCenter.super_dgTemplateVector<float>.m_y = dim.super_dgTemplateVector<float>.m_y;
    massCenter.super_dgTemplateVector<float>.m_z = dim.super_dgTemplateVector<float>.m_z;
    massCenter.super_dgTemplateVector<float>.m_w = dim.super_dgTemplateVector<float>.m_w;
    dim = dVar30;
    dVar30 = dgMatrix::TransformVector(&this->super_dgMatrix,&massCenter);
    uVar10 = massCenter.super_dgTemplateVector<float>._0_8_;
    auVar27._0_8_ = dVar30.super_dgTemplateVector<float>._8_8_;
    auVar27._8_56_ = auVar28;
    auVar29._0_8_ = dVar30.super_dgTemplateVector<float>._0_8_;
    auVar29._8_56_ = auVar25;
    dVar3 = (dgTemplateVector<float>)vmovlhps_avx(auVar29._0_16_,auVar27._0_16_);
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float> = dVar3;
    auVar2._8_8_ = 0;
    massCenter.super_dgTemplateVector<float>.m_x = (float)uVar6;
    massCenter.super_dgTemplateVector<float>.m_y = SUB84(uVar6,4);
    auVar2._0_4_ = massCenter.super_dgTemplateVector<float>.m_x;
    auVar2._4_4_ = massCenter.super_dgTemplateVector<float>.m_y;
    auVar17._8_8_ = 0;
    massCenter.super_dgTemplateVector<float>.m_x = (float)uVar5;
    massCenter.super_dgTemplateVector<float>.m_y = SUB84(uVar5,4);
    auVar17._0_4_ = massCenter.super_dgTemplateVector<float>.m_x;
    auVar17._4_4_ = massCenter.super_dgTemplateVector<float>.m_y;
    auVar19 = vsubps_avx(auVar2,auVar17);
    auVar4 = vinsertps_avx(ZEXT416((uint)(fVar8 - fVar7)),ZEXT416((uint)local_68._0_4_),0x10);
    local_78 = (dgTemplateVector<float>)vmovlhps_avx(auVar19,auVar4);
    massCenter.super_dgTemplateVector<float>._0_8_ = uVar10;
    dgVector::dgVector(&dim,&local_78);
    dVar30 = dim;
    auVar23._8_8_ = 0;
    auVar23._0_4_ = dim.super_dgTemplateVector<float>.m_x;
    auVar23._4_4_ = dim.super_dgTemplateVector<float>.m_y;
    dim.super_dgTemplateVector<float>.m_z = dVar30.super_dgTemplateVector<float>.m_z;
    auVar19._8_4_ = 0x3f000000;
    auVar19._0_8_ = 0x3f0000003f000000;
    auVar19._12_4_ = 0x3f000000;
    auVar19 = vmulps_avx512vl(auVar23,auVar19);
    dim.super_dgTemplateVector<float>.m_w = dVar30.super_dgTemplateVector<float>.m_w;
    auVar4 = vinsertps_avx(ZEXT416((uint)(dim.super_dgTemplateVector<float>.m_z * 0.5)),
                           ZEXT416((uint)dim.super_dgTemplateVector<float>.m_w),0x10);
    local_50 = (dgTemplateVector<float>)vmovlhps_avx(auVar19,auVar4);
    dim = dVar30;
    dgVector::dgVector((dgVector *)&local_78,&local_50);
    dim.super_dgTemplateVector<float> = local_78;
    dVar30.super_dgTemplateVector<float> = dim.super_dgTemplateVector<float>;
    dim.super_dgTemplateVector<float>.m_x = local_78.m_x;
    fVar7 = dim.super_dgTemplateVector<float>.m_x;
    dim.super_dgTemplateVector<float>.m_y = local_78.m_y;
    fVar8 = dim.super_dgTemplateVector<float>.m_y;
    dim.super_dgTemplateVector<float>.m_z = local_78.m_z;
    fVar9 = dim.super_dgTemplateVector<float>.m_z;
    dim.super_dgTemplateVector<float> = dVar30.super_dgTemplateVector<float>;
    SetDimensions(this,(HaF32)fVar7,(HaF32)fVar8,(HaF32)fVar9);
  }
  return;
}

Assistant:

void dgSphere::SetDimensions (const hacd::HaF32 vertex[], hacd::HaI32 strideInBytes, const hacd::HaI32 triangles[], hacd::HaI32 indexCount, const dgMatrix *basis)
{
	dgVector eigen;
	dgVector scaleVector (hacd::HaF32 (1.0f), hacd::HaF32 (1.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f));

	if (indexCount < 3) {
		return;
	}

	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF32));
	if (!basis)	{

		InternalSphere::Statistics (*this, eigen, scaleVector, vertex, triangles, indexCount, stride);

		hacd::HaI32 k = 0;
		for (hacd::HaI32 i = 0; i < 3; i ++) {
			if (k >= 6) {
				 break;
			}
			for (hacd::HaI32 j = i + 1; j < 3; j ++) {
				hacd::HaF32 aspect = InternalSphere::AspectRatio (eigen[i], eigen[j]);
				if (aspect > hacd::HaF32 (0.9f)) {
					scaleVector[i] *= hacd::HaF32 (2.0f); 
					InternalSphere::Statistics (*this, eigen, scaleVector, vertex, triangles, indexCount, stride);
					k ++;
					i = -1;
					break;
				}
			}
		}
	} else {
		*this = *basis;
	}

	dgVector min; 
	dgVector max;
	InternalSphere::BoundingBox (*this, vertex, stride, triangles, indexCount, min, max);

	dgVector massCenter	(max + min);
	massCenter = massCenter.Scale (hacd::HaF32 (0.5f));
	m_posit = TransformVector (massCenter);

	dgVector dim (max - min);
	dim = dim.Scale (hacd::HaF32(0.5f));
	SetDimensions (dim.m_x, dim.m_y, dim.m_z);
}